

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O3

int32_t CompactBy3Bits21(uint64_t x)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = ((x & 0x1249249249249249) >> 2 | x & 0x1249249249249249) & 0x10c30c30c30c30c3;
  uVar3 = (uVar3 >> 4 | uVar3) & 0x100f00f00f00f00f;
  uVar3 = (uVar3 >> 8 | uVar3) & 0x1f0000ff0000ff;
  iVar1 = (int)(uVar3 >> 0x20);
  iVar2 = iVar1 + -0x200000;
  if (uVar3 >> 0x34 == 0) {
    iVar2 = iVar1;
  }
  return iVar2 + ((uint)(uVar3 >> 0x10) | (uint)uVar3 & 0xffff);
}

Assistant:

int32_t CompactBy3Bits21(uint64_t x)
{
    uint64_t d = x & 0x1249249249249249;
    d = (d | d >> 2) & 0x10c30c30c30c30c3;
    d = (d | d >> 4) & 0x100f00f00f00f00f;
    d = (d | d >> 8) & 0x1f0000ff0000ff;
    d = (d | d >> 16) & 0x1f00000000ffff;
    d = (d | d >> 32);

    // sign extension
    d = (d & 0x100000 ? d | 0xffe00000 : d);

    return (int32_t)d;
}